

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O1

ixy_device * virtio_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  size_t size;
  uint32_t uVar1;
  undefined2 *puVar2;
  undefined2 *puVar3;
  long lVar4;
  uint *puVar5;
  long *plVar6;
  long lVar7;
  short sVar8;
  __uid_t _Var9;
  uint uVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  ssize_t sVar14;
  void *pvVar15;
  ulong extraout_RAX;
  undefined8 *puVar16;
  pkt_buf *ppVar17;
  undefined8 extraout_RAX_00;
  undefined4 extraout_var;
  uint *puVar18;
  mempool *pmVar19;
  uint in_ECX;
  ixy_device *piVar20;
  uint uVar21;
  undefined6 in_register_00000012;
  long extraout_RDX;
  long extraout_RDX_00;
  virtio_device *unaff_RBX;
  ixy_device *piVar22;
  undefined6 in_register_00000032;
  ulong uVar23;
  void *__buf;
  ushort uVar24;
  FILE *pFVar25;
  long lVar26;
  long lVar27;
  undefined *unaff_R12;
  undefined *unaff_R13;
  undefined *puVar28;
  uint uVar29;
  FILE *__stream;
  ulong uVar30;
  char *__buf_00;
  dma_memory dVar31;
  ushort auStack_338 [256];
  ixy_device *piStack_138;
  void *pvStack_130;
  ulong uStack_128;
  ushort uStack_11e;
  ushort uStack_11c;
  short sStack_11a;
  ulong uStack_118;
  void *pvStack_110;
  uintptr_t uStack_108;
  undefined4 uStack_fc;
  ixy_device *piStack_f8;
  uint *puStack_f0;
  undefined *puStack_e8;
  mempool *pmStack_e0;
  code *pcStack_d0;
  undefined8 uStack_c8;
  FILE *pFStack_c0;
  uint *puStack_b8;
  ulong uStack_b0;
  code *pcStack_a8;
  undefined8 uStack_a0;
  virtio_device *pvStack_98;
  undefined *puStack_90;
  undefined *puStack_88;
  FILE *pFStack_80;
  char *pcStack_78;
  code *pcStack_70;
  undefined8 local_68;
  ulong local_60;
  char local_4c;
  undefined3 uStack_4b;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  pvVar15 = (void *)(CONCAT62(in_register_00000012,tx_queues) & 0xffffffff);
  __buf_00 = (char *)(CONCAT62(in_register_00000032,rx_queues) & 0xffffffff);
  pcStack_70 = (code *)0x1063ff;
  _Var9 = getuid();
  if (_Var9 != 0) {
    pcStack_70 = (code *)0x106408;
    virtio_init_cold_1();
  }
  if ((ushort)__buf_00 < 2) {
    if (1 < (ushort)pvVar15) goto LAB_00106a50;
    pcStack_70 = (code *)0x106425;
    remove_driver(pci_addr);
    pcStack_70 = (code *)0x106434;
    unaff_RBX = (virtio_device *)calloc(1,0xb0);
    pcStack_70 = (code *)0x10643f;
    pcVar13 = strdup(pci_addr);
    (unaff_RBX->ixy).pci_addr = pcVar13;
    (unaff_RBX->ixy).driver_name = "ixy-virtio";
    (unaff_RBX->ixy).num_rx_queues = (ushort)__buf_00;
    (unaff_RBX->ixy).num_tx_queues = (ushort)pvVar15;
    (unaff_RBX->ixy).rx_batch = virtio_rx_batch;
    (unaff_RBX->ixy).tx_batch = virtio_tx_batch;
    (unaff_RBX->ixy).read_stats = virtio_read_stats;
    (unaff_RBX->ixy).set_promisc = virtio_set_promisc;
    (unaff_RBX->ixy).get_link_speed = virtio_get_link_speed;
    pcStack_70 = (code *)0x106495;
    enable_dma(pci_addr);
    pcStack_70 = (code *)0x1064a6;
    uVar10 = pci_open_resource(pci_addr,"config",0);
    pvVar15 = (void *)(ulong)uVar10;
    in_ECX = 2;
    pcStack_70 = (code *)0x1064be;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,2,2);
    if (sVar14 != 2) goto LAB_00106a57;
    uVar24 = _local_4c;
    __buf_00 = (char *)(ulong)_local_4c;
    pcStack_70 = (code *)0x1064d5;
    close(uVar10);
    if (uVar24 != 0x1000) goto LAB_00106a5c;
    unaff_R13 = &stdout;
    __buf_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c";
    pcStack_70 = (code *)0x106510;
    fprintf(_stdout,"[INFO ] %s:%d %s(): Detected virtio legacy network card\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x160,"virtio_init");
    pcStack_70 = (code *)0x106524;
    uVar10 = pci_open_resource(pci_addr,"resource0",2);
    pvVar15 = (void *)(ulong)uVar10;
    unaff_RBX->fd = uVar10;
    unaff_R12 = &stderr;
    pcStack_70 = (code *)0x106551;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Configuring bar0\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x113,"virtio_legacy_init");
    _local_4c = _local_4c & 0xffffff00;
    in_ECX = 0x12;
    pcStack_70 = (code *)0x10656a;
    sVar14 = pwrite(uVar10,&stack0xffffffffffffffb4,1,0x12);
    if (sVar14 != 1) goto LAB_00106a61;
    pcStack_70 = (code *)0x10658a;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,1,0x12);
    if (sVar14 == 1) {
      pci_addr = &stack0xffffffffffffffb4;
      do {
        if (local_4c == '\0') goto LAB_001065c5;
        pcStack_70 = (code *)0x1065a6;
        usleep(100);
        pcStack_70 = (code *)0x1065ba;
        sVar14 = pread(uVar10,pci_addr,1,0x12);
      } while (sVar14 == 1);
    }
    pcStack_70 = (code *)0x1065c5;
    virtio_init_cold_5();
LAB_001065c5:
    _local_4c = CONCAT31(uStack_4b,1);
    in_ECX = 0x12;
    pcStack_70 = (code *)0x1065de;
    sVar14 = pwrite(uVar10,&stack0xffffffffffffffb4,1,0x12);
    if (sVar14 != 1) goto LAB_00106a66;
    _local_4c = CONCAT31(uStack_4b,2);
    in_ECX = 0x12;
    pcStack_70 = (code *)0x106601;
    sVar14 = pwrite(uVar10,&stack0xffffffffffffffb4,1,0x12);
    if (sVar14 != 1) goto LAB_00106a6b;
    in_ECX = 0;
    pcStack_70 = (code *)0x10661e;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,4,0);
    uVar21 = _local_4c;
    if (sVar14 != 4) goto LAB_00106a70;
    in_ECX = 0x11c;
    pcStack_70 = (code *)0x106655;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Host features: %x\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x11c,"virtio_legacy_init",(ulong)_local_4c);
    pci_addr = (char *)_stderr;
    __buf_00 = (char *)(ulong)~uVar21;
    if ((~uVar21 & 0x8060003) != 0) goto LAB_00106a75;
    in_ECX = 4;
    pFVar25 = (FILE *)(ulong)uVar10;
    pcStack_70 = (code *)0x10667f;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,4,4);
    if (sVar14 != 4) goto LAB_00106a7d;
    __buf_00 = &stack0xffffffffffffffb4;
    pcStack_70 = (code *)0x1066b5;
    fprintf((FILE *)pci_addr,"[DEBUG] %s:%d %s(): Guest features before negotiation: %x\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x123,"virtio_legacy_init",(ulong)_local_4c);
    _local_4c = 0x8060003;
    in_ECX = 4;
    pFVar25 = (FILE *)(ulong)uVar10;
    pcStack_70 = (code *)0x1066d0;
    sVar14 = pwrite(uVar10,__buf_00,4,4);
    __stream = _stderr;
    if (sVar14 != 4) goto LAB_00106a82;
    in_ECX = 4;
    pFVar25 = (FILE *)(ulong)uVar10;
    pcStack_70 = (code *)0x1066f4;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,4,4);
    if (sVar14 != 4) goto LAB_00106a87;
    __buf_00 = &stack0xffffffffffffffb4;
    pcStack_70 = (code *)0x10672a;
    fprintf(__stream,"[DEBUG] %s:%d %s(): Guest features after negotiation: %x\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x125,"virtio_legacy_init",(ulong)_local_4c);
    _local_4c = _local_4c & 0xffff0000;
    in_ECX = 0xe;
    pFVar25 = (FILE *)(ulong)uVar10;
    pcStack_70 = (code *)0x106744;
    sVar14 = pwrite(uVar10,__buf_00,2,0xe);
    if (sVar14 != 2) goto LAB_00106a8c;
    in_ECX = 0xc;
    pFVar25 = (FILE *)(ulong)uVar10;
    pcStack_70 = (code *)0x106764;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,2,0xc);
    uVar21 = _local_4c;
    if (sVar14 != 2) goto LAB_00106a91;
    uVar24 = _local_4c;
    __stream = (FILE *)(ulong)_local_4c;
    uVar29 = _local_4c & 0xffff;
    local_68 = (void *)(CONCAT44(local_68._4_4_,_local_4c) & 0xffffffff0000ffff);
    pcStack_70 = (code *)0x1067a0;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of rx queue #%u: %u\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0xe5,"virtio_legacy_setup_rx_queue",0);
    if (uVar29 == 0) {
LAB_001067a9:
      unaff_R13 = &stdout;
      pcStack_70 = (code *)0x1067b6;
      virtio_legacy_setup_tx_queue(unaff_RBX,1);
      pcStack_70 = (code *)0x1067c3;
      virtio_legacy_setup_tx_queue(unaff_RBX,2);
      uVar10 = unaff_RBX->fd;
      pvVar15 = (void *)(ulong)uVar10;
      _local_4c = CONCAT31(uStack_4b,4);
      in_ECX = 0x12;
      pFVar25 = (FILE *)(ulong)uVar10;
      pcStack_70 = (code *)0x1067e2;
      sVar14 = pwrite(uVar10,&stack0xffffffffffffffb4,1,0x12);
      if (sVar14 != 1) goto LAB_00106a96;
      pcStack_70 = (code *)0x106811;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Setup complete\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x12e,"virtio_legacy_init");
      in_ECX = 0x12;
      pFVar25 = (FILE *)(ulong)uVar10;
      pcStack_70 = (code *)0x106827;
      sVar14 = pread(uVar10,&stack0xffffffffffffffb4,1,0x12);
      if (sVar14 != 1) goto LAB_00106a9b;
      if (local_4c != -0x80) {
        pcStack_70 = (code *)0x106849;
        virtio_legacy_set_promiscuous(unaff_RBX,true);
        return &unaff_RBX->ixy;
      }
      goto LAB_00106aa0;
    }
    in_ECX = 0x10;
    pFVar25 = (FILE *)(ulong)uVar10;
    pcStack_70 = (code *)0x106871;
    sVar14 = pread(uVar10,&stack0xffffffffffffffb4,2,0x10);
    if (sVar14 == 2) {
      local_38 = (ulong)_local_4c;
      pcStack_70 = (code *)0x1068ae;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): Notifcation offset %u\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xea,"virtio_legacy_setup_rx_queue");
      local_48 = (ulong)((uVar21 & 0xffff) * 8);
      __buf_00 = (char *)((ulong)(((uVar21 & 0xffff) + (uVar21 & 0xffff) * 8) * 2 + 0x1003 &
                                 0x3ff000) + 4 + local_48);
      pcStack_70 = (code *)0x1068dd;
      dVar31 = memory_allocate_dma((size_t)__buf_00,true);
      pvVar15 = dVar31.virt;
      pcStack_70 = (code *)0x1068f3;
      memset(pvVar15,0xab,(size_t)__buf_00);
      pcStack_70 = (code *)0x106924;
      local_68 = pvVar15;
      local_40 = pvVar15;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xee,"virtio_legacy_setup_rx_queue",__buf_00);
      pFVar25 = (FILE *)(ulong)(uint)unaff_RBX->fd;
      unaff_R13 = (undefined *)(dVar31.phy >> 0xc);
      _local_4c = (uint)unaff_R13;
      in_ECX = 8;
      pcStack_70 = (code *)0x106942;
      sVar14 = pwrite(unaff_RBX->fd,&stack0xffffffffffffffb4,4,8);
      if (sVar14 != 4) goto LAB_00106aaa;
      __buf_00 = (char *)(ulong)(uVar21 & 0xffff);
      pcStack_70 = (code *)0x106962;
      puVar18 = (uint *)calloc(1,local_48 + 0x38);
      *puVar18 = uVar21 & 0xffff;
      *(void **)(puVar18 + 2) = local_40;
      local_68 = (void *)((ulong)uVar24 * 0x10 + (long)local_40);
      *(void **)(puVar18 + 4) = local_68;
      local_60 = (long)local_68 + (long)__buf_00 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar18 + 6) = local_60;
      pcStack_70 = (code *)0x1069bf;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xf4,"virtio_legacy_setup_rx_queue");
      uVar10 = *puVar18;
      if ((ulong)uVar10 != 0) {
        lVar4 = *(long *)(puVar18 + 2);
        lVar27 = *(long *)(puVar18 + 4);
        lVar7 = *(long *)(puVar18 + 6);
        lVar26 = 0;
        do {
          puVar16 = (undefined8 *)(lVar4 + lVar26 * 8);
          *puVar16 = 0;
          puVar16[1] = 0;
          *(undefined2 *)(lVar27 + 4 + lVar26) = 0;
          *(undefined8 *)(lVar7 + 4 + lVar26 * 4) = 0;
          lVar26 = lVar26 + 2;
        } while ((ulong)uVar10 * 2 != lVar26);
      }
      puVar2 = *(undefined2 **)(puVar18 + 6);
      puVar2[1] = 0;
      puVar3 = *(undefined2 **)(puVar18 + 4);
      puVar3[1] = 0;
      *(undefined2 *)(puVar18 + 10) = 0;
      *(ulong *)(puVar18 + 8) = local_38;
      *puVar3 = 1;
      *puVar2 = 0;
      __stream = (FILE *)((ulong)uVar24 << 2);
      pcStack_70 = (code *)0x106a34;
      pmVar19 = memory_allocate_mempool((uint32_t)__stream,0x800);
      *(mempool **)(puVar18 + 0xc) = pmVar19;
      unaff_RBX->rx_queue = puVar18;
      goto LAB_001067a9;
    }
  }
  else {
    pcStack_70 = (code *)0x106a50;
    virtio_init_cold_21();
LAB_00106a50:
    pcStack_70 = (code *)0x106a57;
    virtio_init_cold_20();
LAB_00106a57:
    pcStack_70 = (code *)0x106a5c;
    virtio_init_cold_2();
LAB_00106a5c:
    pcStack_70 = (code *)0x106a61;
    virtio_init_cold_3();
LAB_00106a61:
    pcStack_70 = (code *)0x106a66;
    virtio_init_cold_4();
LAB_00106a66:
    pcStack_70 = (code *)0x106a6b;
    virtio_init_cold_6();
LAB_00106a6b:
    pcStack_70 = (code *)0x106a70;
    virtio_init_cold_7();
LAB_00106a70:
    pcStack_70 = (code *)0x106a75;
    virtio_init_cold_8();
LAB_00106a75:
    pcStack_70 = (code *)0x106a7d;
    pFVar25 = (FILE *)pci_addr;
    virtio_init_cold_9();
LAB_00106a7d:
    pcStack_70 = (code *)0x106a82;
    virtio_init_cold_10();
LAB_00106a82:
    __stream = (FILE *)pci_addr;
    pcStack_70 = (code *)0x106a87;
    virtio_init_cold_11();
LAB_00106a87:
    pcStack_70 = (code *)0x106a8c;
    virtio_init_cold_12();
LAB_00106a8c:
    pcStack_70 = (code *)0x106a91;
    virtio_init_cold_13();
LAB_00106a91:
    pcStack_70 = (code *)0x106a96;
    virtio_init_cold_14();
LAB_00106a96:
    pcStack_70 = (code *)0x106a9b;
    virtio_init_cold_17();
LAB_00106a9b:
    pcStack_70 = (code *)0x106aa0;
    virtio_init_cold_18();
LAB_00106aa0:
    pcStack_70 = (code *)0x106aa5;
    virtio_init_cold_19();
  }
  pcStack_70 = (code *)0x106aaa;
  virtio_init_cold_15();
LAB_00106aaa:
  pcStack_70 = virtio_rx_batch;
  virtio_init_cold_16();
  puVar18 = (uint *)pFVar25->_old_offset;
  uStack_a0 = extraout_RAX;
  pvStack_98 = unaff_RBX;
  puStack_90 = unaff_R12;
  puStack_88 = unaff_R13;
  pFStack_80 = __stream;
  pcStack_78 = __buf_00;
  pcStack_70 = (code *)pvVar15;
  if (in_ECX == 0) {
    uVar30 = 0;
  }
  else {
    uVar30 = 0;
    do {
      uVar24 = (ushort)puVar18[10];
      lVar4 = *(long *)(puVar18 + 6);
      if (uVar24 == *(ushort *)(lVar4 + 2)) goto LAB_00106b56;
      uVar23 = (ulong)uVar24 % (ulong)*puVar18;
      lVar27 = (ulong)*(uint *)(lVar4 + 4 + uVar23 * 8) * 0x10;
      *(ushort *)(puVar18 + 10) = uVar24 + 1;
      uVar24 = *(ushort *)(*(long *)(puVar18 + 2) + 0xc + lVar27);
      pmVar19 = (mempool *)(ulong)uVar24;
      if (uVar24 != 2) {
        pcStack_a8 = (code *)0x106c42;
        virtio_rx_batch_cold_1();
        goto LAB_00106c42;
      }
      puVar16 = (undefined8 *)(*(long *)(puVar18 + 2) + lVar27);
      *puVar16 = 0;
      puVar16[1] = 0;
      lVar27 = *(long *)(puVar18 + (ulong)*(uint *)(lVar4 + 4 + uVar23 * 8) * 2 + 0xe);
      uVar10 = *(int *)(lVar4 + 8 + uVar23 * 8) - 10;
      *(uint *)(lVar27 + 0x14) = uVar10;
      *(long *)(extraout_RDX + uVar30 * 8) = lVar27;
      pFVar25->__pad2 = (void *)((long)pFVar25->__pad2 + (ulong)uVar10);
      pFVar25->_offset = pFVar25->_offset + 1;
      uVar30 = uVar30 + 1;
    } while (in_ECX != uVar30);
    uVar30 = (ulong)in_ECX;
  }
LAB_00106b56:
  if (*puVar18 != 0) {
    puVar28 = (undefined *)0x0;
    do {
      __buf_00 = (char *)((ulong)puVar28 & 0xffff);
      in_ECX = (int)__buf_00 << 4;
      if (*(long *)(*(long *)(puVar18 + 2) + (ulong)in_ECX) == 0) {
        pmVar19 = *(mempool **)(puVar18 + 0xc);
        pcStack_a8 = (code *)0x106b8a;
        ppVar17 = pkt_buf_alloc(pmVar19);
        pvVar15 = (void *)0x0;
        unaff_R13 = puVar28;
        if (ppVar17 == (pkt_buf *)0x0) goto LAB_00106c42;
        uVar1 = *(uint32_t *)(*(long *)(puVar18 + 0xc) + 8);
        ppVar17->size = uVar1;
        ppVar17->head_room[0x26] = '\0';
        ppVar17->head_room[0x27] = '\0';
        ppVar17->head_room[0x1e] = '\0';
        ppVar17->head_room[0x1f] = '\0';
        ppVar17->head_room[0x20] = '*';
        ppVar17->head_room[0x21] = '\0';
        ppVar17->head_room[0x22] = '\0';
        ppVar17->head_room[0x23] = '\0';
        ppVar17->head_room[0x24] = '\0';
        ppVar17->head_room[0x25] = '\0';
        lVar4 = *(long *)(puVar18 + 2);
        uVar23 = (ulong)(uint)((int)__buf_00 << 4);
        *(uint32_t *)(lVar4 + 8 + uVar23) = uVar1 + 10;
        *(uintptr_t *)(lVar4 + uVar23) = ppVar17->buf_addr_phy + 0x36;
        *(undefined4 *)(lVar4 + 0xc + uVar23) = 2;
        *(pkt_buf **)(puVar18 + (long)__buf_00 * 2 + 0xe) = ppVar17;
        *(short *)(*(long *)(puVar18 + 4) + 4 +
                  ((ulong)*(ushort *)(*(long *)(puVar18 + 4) + 2) % (ulong)*puVar18) * 2) =
             (short)puVar28;
        *(short *)(*(long *)(puVar18 + 4) + 2) = *(short *)(*(long *)(puVar18 + 4) + 2) + 1;
        pmVar19 = (mempool *)(ulong)(uint)pFVar25->_fileno;
        uStack_a0 = uStack_a0 & 0xffffffffffff;
        in_ECX = 0x10;
        pcStack_a8 = (code *)0x106c14;
        sVar14 = pwrite(pFVar25->_fileno,(void *)((long)&uStack_a0 + 6),2,0x10);
        if (sVar14 != 2) goto LAB_00106c47;
      }
      uVar10 = (int)puVar28 + 1;
      puVar28 = (undefined *)(ulong)uVar10;
    } while ((uVar10 & 0xffff) < *puVar18);
  }
  return (ixy_device *)(uVar30 & 0xffffffff);
LAB_00106c42:
  pcStack_a8 = (code *)0x106c47;
  virtio_rx_batch_cold_3();
LAB_00106c47:
  pcStack_a8 = virtio_tx_batch;
  virtio_rx_batch_cold_2();
  piVar22 = (ixy_device *)(ulong)in_ECX;
  puVar5 = *(uint **)&pmVar19[5].buf_size;
  uStack_c8 = extraout_RAX_00;
  pFStack_c0 = pFVar25;
  puStack_b8 = puVar18;
  uStack_b0 = uVar30;
  pcStack_a8 = (code *)__buf_00;
  while( true ) {
    if ((ushort)puVar5[10] == *(ushort *)(*(long *)(puVar5 + 6) + 2)) break;
    lVar4 = *(long *)(puVar5 + 2);
    uVar30 = (ulong)*(uint *)(*(long *)(puVar5 + 6) + 4 +
                             ((ulong)(ushort)puVar5[10] % (ulong)*puVar5) * 8);
    lVar27 = uVar30 * 0x10;
    *(undefined8 *)(lVar4 + lVar27) = 0;
    *(undefined4 *)(lVar4 + 8 + lVar27) = 0;
    pcStack_d0 = (code *)0x106caa;
    pkt_buf_free(*(pkt_buf **)(puVar5 + uVar30 * 2 + 0xe));
    *(short *)(puVar5 + 10) = (short)puVar5[10] + 1;
  }
  if (in_ECX == 0) {
    piVar22 = (ixy_device *)0x0;
  }
  else {
    piVar20 = (ixy_device *)0x0;
    uVar24 = 0;
    do {
      uVar10 = *puVar5;
      uVar21 = (uint)uVar24;
      if (uVar24 < uVar10) {
        lVar4 = *(long *)(*(long *)(puVar5 + 2) + (ulong)uVar24 * 0x10);
        while (lVar4 != 0) {
          uVar24 = uVar24 + 1;
          uVar21 = (uint)uVar24;
          if (uVar10 <= uVar24) break;
          lVar4 = *(long *)(*(long *)(puVar5 + 2) + (ulong)uVar24 * 0x10);
        }
      }
      if (uVar10 == uVar21) {
        piVar22 = (ixy_device *)((ulong)piVar20 & 0xffffffff);
        break;
      }
      plVar6 = *(long **)(extraout_RDX_00 + (long)piVar20 * 8);
      uVar10 = *(uint *)((long)plVar6 + 0x14);
      pmVar19[7].base_addr = (void *)((long)pmVar19[7].base_addr + (ulong)uVar10);
      *(long *)&pmVar19[6].buf_size = *(long *)&pmVar19[6].buf_size + 1;
      *(long **)(puVar5 + (ulong)uVar24 * 2 + 0xe) = plVar6;
      *(undefined2 *)((long)plVar6 + 0x3e) = 0;
      *(undefined8 *)((long)plVar6 + 0x36) = 0x2a0000;
      lVar4 = *(long *)(puVar5 + 2);
      lVar27 = (ulong)uVar24 * 0x10;
      *(uint *)(lVar4 + 8 + lVar27) = uVar10 + 10;
      *(long *)(lVar4 + lVar27) = *plVar6 + 0x36;
      *(undefined4 *)(lVar4 + 0xc + lVar27) = 0;
      *(ushort *)
       (*(long *)(puVar5 + 4) + 4 +
       ((ulong)((uint)*(ushort *)(*(long *)(puVar5 + 4) + 2) + (int)piVar20) % (ulong)*puVar5) * 2)
           = uVar24;
      piVar20 = (ixy_device *)((long)&piVar20->pci_addr + 1);
    } while (piVar20 != piVar22);
  }
  *(short *)(*(long *)(puVar5 + 4) + 2) = *(short *)(*(long *)(puVar5 + 4) + 2) + (short)piVar22;
  piVar20 = (ixy_device *)(ulong)pmVar19[4].free_stack_top;
  __buf = (void *)((long)&uStack_c8 + 6);
  uStack_c8 = CONCAT26(1,(undefined6)uStack_c8);
  pcStack_d0 = (code *)0x106db2;
  sVar14 = pwrite(pmVar19[4].free_stack_top,__buf,2,0x10);
  uVar10 = (uint)__buf;
  if (sVar14 == 2) {
    return piVar22;
  }
  pcStack_d0 = virtio_legacy_setup_tx_queue;
  virtio_tx_batch_cold_1();
  sVar8 = (short)uVar10;
  piStack_f8 = piVar22;
  puStack_f0 = puVar5;
  puStack_e8 = unaff_R13;
  pmStack_e0 = pmVar19;
  pcStack_d0 = (code *)pvVar15;
  if ((ushort)(sVar8 - 3U) < 0xfffe) {
    piStack_138 = (ixy_device *)0x10708a;
    virtio_legacy_setup_tx_queue_cold_5();
    iVar11 = (int)piVar20;
LAB_0010708a:
    piStack_138 = (ixy_device *)0x10708f;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_0010708f:
    piStack_138 = (ixy_device *)0x107094;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    iVar11 = *(int *)&piVar20[1].pci_addr;
    piStack_138 = (ixy_device *)0x106e08;
    sStack_11a = sVar8;
    sVar14 = pwrite(iVar11,&sStack_11a,2,0xe);
    piVar22 = piVar20;
    if (sVar14 != 2) goto LAB_0010708a;
    iVar11 = *(int *)&piVar20[1].pci_addr;
    piStack_138 = (ixy_device *)0x106e29;
    sVar14 = pread(iVar11,&uStack_11e,2,0xc);
    if (sVar14 != 2) goto LAB_0010708f;
    pvStack_130 = (void *)CONCAT44(pvStack_130._4_4_,(uint)uStack_11e);
    piStack_138 = (ixy_device *)0x106e6d;
    iVar11 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                     ,0x37,"virtio_legacy_setup_tx_queue",(ulong)(uVar10 & 0xffff));
    uVar10 = (uint)uStack_11e;
    if (uStack_11e == 0) {
      return (ixy_device *)CONCAT44(extraout_var,iVar11);
    }
    uStack_118 = (ulong)uVar10;
    size = (ulong)(((uint)uStack_11e + (uint)uStack_11e * 8) * 2 + 0x1003 & 0x3ff000) + 4 +
           uStack_118 * 8;
    piStack_138 = (ixy_device *)0x106eab;
    dVar31 = memory_allocate_dma(size,true);
    uStack_108 = dVar31.phy;
    pvVar15 = dVar31.virt;
    piStack_138 = (ixy_device *)0x106ec3;
    memset(pvVar15,0xab,size);
    piStack_138 = (ixy_device *)0x106ef4;
    pvStack_130 = pvVar15;
    pvStack_110 = pvVar15;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    iVar11 = *(int *)&piVar20[1].pci_addr;
    uStack_fc = (undefined4)(uStack_108 >> 0xc);
    piStack_138 = (ixy_device *)0x106f16;
    sVar14 = pwrite(iVar11,&uStack_fc,4,8);
    if (sVar14 == 4) {
      piStack_138 = (ixy_device *)0x106f32;
      puVar18 = (uint *)calloc(1,(ulong)uStack_11e * 8 + 0x38);
      *puVar18 = uVar10;
      *(void **)(puVar18 + 2) = pvStack_110;
      pvStack_130 = (void *)((ulong)(uint)((int)uStack_118 << 4) + (long)pvStack_110);
      *(void **)(puVar18 + 4) = pvStack_130;
      uStack_128 = (long)pvStack_130 + uStack_118 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar18 + 6) = uStack_128;
      piStack_138 = (ixy_device *)0x106f95;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar21 = *puVar18;
      if ((ulong)uVar21 != 0) {
        lVar4 = *(long *)(puVar18 + 2);
        lVar27 = *(long *)(puVar18 + 4);
        lVar7 = *(long *)(puVar18 + 6);
        lVar26 = 0;
        do {
          puVar16 = (undefined8 *)(lVar4 + lVar26 * 8);
          *puVar16 = 0;
          puVar16[1] = 0;
          *(undefined2 *)(lVar27 + 4 + lVar26) = 0;
          *(undefined8 *)(lVar7 + 4 + lVar26 * 4) = 0;
          lVar26 = lVar26 + 2;
        } while ((ulong)uVar21 * 2 != lVar26);
      }
      *(undefined2 *)(*(long *)(puVar18 + 6) + 2) = 0;
      *(undefined2 *)(*(long *)(puVar18 + 4) + 2) = 0;
      *(undefined2 *)(puVar18 + 10) = 0;
      iVar11 = *(int *)&piVar20[1].pci_addr;
      piStack_138 = (ixy_device *)0x107005;
      sVar14 = pread(iVar11,&uStack_11c,2,0x10);
      if (sVar14 == 2) {
        piStack_138 = (ixy_device *)0x10703c;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x54,"virtio_legacy_setup_tx_queue",(ulong)uStack_11c);
        *(ulong *)(puVar18 + 8) = (ulong)uStack_11c;
        if (sVar8 == 2) {
          piStack_138 = (ixy_device *)0x107055;
          pmVar19 = memory_allocate_mempool(uVar10,0x800);
          *(mempool **)(puVar18 + 0xc) = pmVar19;
        }
        **(undefined2 **)(puVar18 + 4) = 1;
        **(undefined2 **)(puVar18 + 6) = 0;
        *(uint **)(&piVar20[1].num_rx_queues + (long)(ulong)(sVar8 != 1) * 4) = puVar18;
        return (ixy_device *)(ulong)(sVar8 != 1);
      }
      goto LAB_00107099;
    }
  }
  piStack_138 = (ixy_device *)0x107099;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_00107099:
  piStack_138 = (ixy_device *)0x10709e;
  virtio_legacy_setup_tx_queue_cold_4();
  piStack_138 = piVar22;
  iVar12 = ioctl(iVar11,0x3b6c);
  if (iVar12 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_338[0] = 0;
    sVar14 = pread(iVar11,auStack_338,2,4);
    if (sVar14 == 2) {
      auStack_338[0] = auStack_338[0] | 4;
      sVar14 = pwrite(iVar11,auStack_338,2,4);
      if (sVar14 != 2) {
        __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                      ,0x27,"void vfio_enable_dma(int)");
      }
      return (ixy_device *)0x2;
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

struct ixy_device* virtio_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > 1) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, 1);
	}
	if (tx_queues > 1) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, 1);
	}
	remove_driver(pci_addr);
	struct virtio_device* dev = calloc(1, sizeof(*dev));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = virtio_rx_batch;
	dev->ixy.tx_batch = virtio_tx_batch;
	dev->ixy.read_stats = virtio_read_stats;
	dev->ixy.set_promisc = virtio_set_promisc;
	dev->ixy.get_link_speed = virtio_get_link_speed;
	enable_dma(pci_addr);
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t device_id = read_io16(config, 2);
	close(config);
	// Check config if device is legacy network card
	if (device_id == 0x1000) {
		info("Detected virtio legacy network card");
		dev->fd = pci_open_resource(pci_addr, "resource0", O_RDWR);
		virtio_legacy_init(dev);
	} else {
		error("Modern device not supported");
	}
	return &dev->ixy;
}